

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExperimental.cxx
# Opt level: O2

bool cmExperimental::HasSupportEnabled(cmMakefile *mf,Feature f)

{
  bool bVar1;
  FeatureData *pFVar2;
  cmValue l;
  string_view r;
  
  pFVar2 = anon_unknown.dwarf_a8c474::DataForFeature(f);
  l = cmMakefile::GetDefinition(mf,&pFVar2->Variable);
  r._M_str = (pFVar2->Uuid)._M_dataplus._M_p;
  r._M_len = (pFVar2->Uuid)._M_string_length;
  bVar1 = ::operator==(l,r);
  if ((bVar1) && (pFVar2->Warned == false)) {
    cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&pFVar2->Description);
    pFVar2->Warned = true;
  }
  return bVar1;
}

Assistant:

bool cmExperimental::HasSupportEnabled(cmMakefile const& mf, Feature f)
{
  bool enabled = false;
  auto& data = ::DataForFeature(f);

  auto value = mf.GetDefinition(data.Variable);
  if (value == data.Uuid) {
    enabled = true;
  }

  if (enabled && !data.Warned) {
    mf.IssueMessage(MessageType::AUTHOR_WARNING, data.Description);
    data.Warned = true;
  }

  return enabled;
}